

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aircraft.cpp
# Opt level: O1

void __thiscall XPMP2::Aircraft::SetRender(Aircraft *this,bool _bRender)

{
  list<void_*,_std::allocator<void_*>_> *plVar1;
  size_t *psVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  pthread_t pVar5;
  bool bVar6;
  
  if ((this->bRender == _bRender) || (this->bRender = _bRender, _bRender)) {
    return;
  }
  pVar5 = pthread_self();
  bVar6 = true;
  if (pVar5 == DAT_002ef7b0) {
    (*this->_vptr_Aircraft[0xe])(this);
    ContrailRemove(this);
    plVar1 = &this->listInst;
    if ((this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)plVar1) {
      p_Var3 = (plVar1->super__List_base<void_*,_std::allocator<void_*>_>)._M_impl._M_node.
               super__List_node_base._M_next;
      while (p_Var3 != (_List_node_base *)plVar1) {
        p_Var3 = (this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
                 super__List_node_base._M_prev;
        p_Var4 = p_Var3[1]._M_next;
        psVar2 = &(this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node
                  ._M_size;
        *psVar2 = *psVar2 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var3,0x18);
        XPLMDestroyInstance(p_Var4);
        p_Var3 = (this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
                 super__List_node_base._M_next;
      }
      if (glob < 1) {
        bVar6 = false;
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Aircraft.cpp"
               ,0x2d2,"DestroyInstances",logDEBUG,"Aircraft 0x%06X: Instance destroyed",
               (ulong)this->modeS_id);
        goto LAB_002230e0;
      }
    }
    bVar6 = false;
  }
LAB_002230e0:
  this->bDestroyInst = bVar6;
  return;
}

Assistant:

void Aircraft::SetRender (bool _bRender)
{
    // no change?
    if (bRender == _bRender)
        return;
    
    // Set the flag
    bRender = _bRender;
    
    // In case rendering is _now_ switched off: Remove the instance (but leave AI as is!)
    if (!bRender)
        DestroyInstances();
}